

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenBinary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef left,
              BinaryenExpressionRef right)

{
  Binary *this;
  
  this = (Binary *)MixedArena::allocSpace(&module->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this->op = op;
  this->left = left;
  this->right = right;
  wasm::Binary::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenBinary(BinaryenModuleRef module,
                                     BinaryenOp op,
                                     BinaryenExpressionRef left,
                                     BinaryenExpressionRef right) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBinary(BinaryOp(op), (Expression*)left, (Expression*)right));
}